

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O0

void __thiscall value_values::test_method(value_values *this)

{
  undefined8 uVar1;
  bool bVar2;
  byte bVar3;
  lazy_ostream *plVar4;
  basic_cstring<const_char> local_480;
  basic_cstring<const_char> local_470;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_460;
  basic_cstring<const_char> local_440;
  assertion_result local_430;
  basic_cstring<const_char> local_418;
  basic_cstring<const_char> local_408;
  basic_cstring<const_char> local_3f8;
  output_test_stream local_3e8 [8];
  output_test_stream output;
  basic_cstring<const_char> local_268;
  basic_cstring<const_char> local_258;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_248;
  assertion_result local_228;
  basic_cstring<const_char> local_210;
  basic_cstring<const_char> local_200;
  Value local_1f0 [8];
  Value vvs;
  basic_cstring<const_char> local_1e0;
  basic_cstring<const_char> local_1d0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_1c0;
  assertion_result local_1a0;
  basic_cstring<const_char> local_188;
  basic_cstring<const_char> local_178;
  size_type local_168;
  size_type local_160;
  basic_cstring<const_char> local_158;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_148;
  basic_cstring<const_char> local_120;
  basic_cstring<const_char> local_110;
  vector<dynamicgraph::command::Value,_std::allocator<dynamicgraph::command::Value>_> *local_100;
  Values *vs;
  basic_cstring<const_char> local_f0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_e0;
  basic_cstring<const_char> local_b8;
  basic_cstring<const_char> local_a8;
  Value local_98 [8];
  Value vvalues;
  undefined1 local_88 [8];
  Values values;
  Value vd1;
  Value local_60 [8];
  Value vs1;
  double local_50;
  double d1;
  allocator<char> local_31;
  string local_30 [8];
  string s1;
  value_values *this_local;
  
  s1.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_30,"value #1",&local_31);
  std::allocator<char>::~allocator(&local_31);
  local_50 = 0.3;
  dynamicgraph::command::Value::Value(local_60,local_30);
  dynamicgraph::command::Value::Value
            ((Value *)&values.
                       super__Vector_base<dynamicgraph::command::Value,_std::allocator<dynamicgraph::command::Value>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_50);
  std::vector<dynamicgraph::command::Value,_std::allocator<dynamicgraph::command::Value>_>::vector
            ((vector<dynamicgraph::command::Value,_std::allocator<dynamicgraph::command::Value>_> *)
             local_88);
  std::vector<dynamicgraph::command::Value,_std::allocator<dynamicgraph::command::Value>_>::
  push_back((vector<dynamicgraph::command::Value,_std::allocator<dynamicgraph::command::Value>_> *)
            local_88,local_60);
  std::vector<dynamicgraph::command::Value,_std::allocator<dynamicgraph::command::Value>_>::
  push_back((vector<dynamicgraph::command::Value,_std::allocator<dynamicgraph::command::Value>_> *)
            local_88,(value_type *)
                     &values.
                      super__Vector_base<dynamicgraph::command::Value,_std::allocator<dynamicgraph::command::Value>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  dynamicgraph::command::Value::Value(local_98,(vector *)local_88);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a8,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_b8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_a8,0x194,&local_b8);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_e0,plVar4,(char (*) [1])0x1217ff);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_f0,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
               ,0x60);
    vs._4_4_ = dynamicgraph::command::Value::type();
    vs._0_4_ = 0xc;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,dynamicgraph::command::Value::Type,dynamicgraph::command::Value::Type>
              (&local_e0,&local_f0,0x194,1,2,(long)&vs + 4,"vvalues.type()",&vs,"Value::VALUES");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_e0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  local_100 = (vector<dynamicgraph::command::Value,_std::allocator<dynamicgraph::command::Value>_> *
              )dynamicgraph::command::Value::constValuesValue();
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_110,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_120);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_110,0x198,&local_120);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_148,plVar4,(char (*) [1])0x1217ff);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_158,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
               ,0x60);
    local_160 = std::
                vector<dynamicgraph::command::Value,_std::allocator<dynamicgraph::command::Value>_>
                ::size(local_100);
    local_168 = std::
                vector<dynamicgraph::command::Value,_std::allocator<dynamicgraph::command::Value>_>
                ::size((vector<dynamicgraph::command::Value,_std::allocator<dynamicgraph::command::Value>_>
                        *)local_88);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (&local_148,&local_158,0x198,1,2,&local_160,"vs.size()",&local_168,"values.size()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_148);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_178,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_188);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_178,0x199,&local_188);
    bVar2 = std::operator==(local_100,
                            (vector<dynamicgraph::command::Value,_std::allocator<dynamicgraph::command::Value>_>
                             *)local_88);
    boost::test_tools::assertion_result::assertion_result(&local_1a0,bVar2);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1d0,"vs == values",0xc);
    boost::unit_test::operator<<(&local_1c0,plVar4,&local_1d0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
               ,0x60);
    boost::test_tools::tt_detail::report_assertion(&local_1a0,&local_1c0,&local_1e0,0x199,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_1c0);
    boost::test_tools::assertion_result::~assertion_result(&local_1a0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  dynamicgraph::command::Value::Value(local_1f0,local_98);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_200,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_210);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_200,0x1a3,&local_210);
    bVar3 = dynamicgraph::command::Value::operator==(local_1f0,local_98);
    boost::test_tools::assertion_result::assertion_result(&local_228,(bool)(bVar3 & 1));
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_258,"vvs == vvalues",0xe);
    boost::unit_test::operator<<(&local_248,plVar4,&local_258);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_268,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
               ,0x60);
    boost::test_tools::tt_detail::report_assertion(&local_228,&local_248,&local_268,0x1a3,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_248);
    boost::test_tools::assertion_result::~assertion_result(&local_228);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  dynamicgraph::command::Value::~Value(local_1f0);
  boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_3f8);
  boost::test_tools::output_test_stream::output_test_stream(local_3e8,&local_3f8,1);
  dynamicgraph::command::operator<<((ostream *)local_3e8,local_98);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_408,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_418);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_408,0x1ad,&local_418);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              (&local_440,
               "Type=values, value=[ Value(Type=string, value=value #1), Value(Type=double, value=0.3), ]"
              );
    boost::test_tools::output_test_stream::is_equal(&local_430,local_3e8,&local_440,1);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_470,
               "output.is_equal(\"Type=values, value=[ \" \"Value(Type=string, value=value #1), \" \"Value(Type=double, value=0.3), \" \"]\")"
               ,0x75);
    boost::unit_test::operator<<(&local_460,plVar4,&local_470);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_480,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
               ,0x60);
    boost::test_tools::tt_detail::report_assertion(&local_430,&local_460,&local_480,0x1ad,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_460);
    boost::test_tools::assertion_result::~assertion_result(&local_430);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  boost::test_tools::output_test_stream::~output_test_stream(local_3e8);
  dynamicgraph::command::Value::~Value(local_98);
  std::vector<dynamicgraph::command::Value,_std::allocator<dynamicgraph::command::Value>_>::~vector
            ((vector<dynamicgraph::command::Value,_std::allocator<dynamicgraph::command::Value>_> *)
             local_88);
  dynamicgraph::command::Value::~Value
            ((Value *)&values.
                       super__Vector_base<dynamicgraph::command::Value,_std::allocator<dynamicgraph::command::Value>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  dynamicgraph::command::Value::~Value(local_60);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(value_values) {
  using namespace dynamicgraph::command;

  std::string s1("value #1");
  double d1 = 0.3;

  Value vs1(s1);
  Value vd1(d1);

  Values values;
  values.push_back(vs1);
  values.push_back(vd1);

  Value vvalues(values);

  BOOST_CHECK_EQUAL(vvalues.type(), Value::VALUES);

  {  // Const ref
    const Values &vs = vvalues.constValuesValue();
    BOOST_CHECK_EQUAL(vs.size(), values.size());
    BOOST_CHECK(vs == values);
  }
  {
      // Cast does not work.
      // dg::command::EitherType eitherType (vvalues);
      // Values vs = static_cast<Values>(eitherType);
      // BOOST_CHECK_EQUAL(vs.size(), values.size());
      // BOOST_CHECK(vs == values);
  } {  // Constructor
    Value vvs(vvalues);
    BOOST_CHECK(vvs == vvalues);
  }

  {
    output_test_stream output;
    output << vvalues;
    BOOST_CHECK(
        output.is_equal("Type=values, value=[ "
                        "Value(Type=string, value=value #1), "
                        "Value(Type=double, value=0.3), "
                        "]"));
  }
}